

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O3

mfb_update_state mfb_update_events(mfb_window *window)

{
  mfb_update_state mVar1;
  
  if (window != (mfb_window *)0x0) {
    if (window[0x2aa] == (mfb_window)0x1) {
      destroy_window_data((SWindowData *)window);
      mVar1 = STATE_EXIT;
    }
    else {
      XFlush(*(undefined8 *)(*(long *)window + 8));
      processEvents((SWindowData *)window);
      mVar1 = STATE_OK;
    }
    return mVar1;
  }
  return STATE_INVALID_WINDOW;
}

Assistant:

mfb_update_state
mfb_update_events(struct mfb_window *window) {
    if (window == 0x0) {
        return STATE_INVALID_WINDOW;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return STATE_EXIT;
    }

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    XFlush(window_data_x11->display);
    processEvents(window_data);

    return STATE_OK;
}